

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void do_sarray_io(j_common_ptr cinfo,jvirt_sarray_ptr ptr,boolean writing)

{
  uint uVar1;
  long lVar2;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long i;
  long thisrow;
  long rows;
  long byte_count;
  long file_offset;
  long bytesperrow;
  boolean writing_local;
  jvirt_sarray_ptr ptr_local;
  j_common_ptr cinfo_local;
  
  uVar1 = ptr->samplesperrow;
  byte_count = (ulong)ptr->cur_start_row * (ulong)uVar1;
  local_50 = 0;
  while( true ) {
    if ((long)(ulong)ptr->rows_in_mem <= local_50) {
      return;
    }
    if ((long)(ulong)ptr->rowsperchunk < (long)((ulong)ptr->rows_in_mem - local_50)) {
      local_58 = (ulong)ptr->rowsperchunk;
    }
    else {
      local_58 = (ulong)ptr->rows_in_mem - local_50;
    }
    lVar2 = (ulong)ptr->cur_start_row + local_50;
    if ((long)local_58 < (long)((ulong)ptr->first_undef_row - lVar2)) {
      local_60 = local_58;
    }
    else {
      local_60 = (ulong)ptr->first_undef_row - lVar2;
    }
    if ((long)local_60 < (long)((ulong)ptr->rows_in_array - lVar2)) {
      local_68 = local_60;
    }
    else {
      local_68 = (ulong)ptr->rows_in_array - lVar2;
    }
    if ((long)local_68 < 1) break;
    lVar2 = local_68 * uVar1;
    if (writing == 0) {
      (*(ptr->b_s_info).read_backing_store)
                (cinfo,&ptr->b_s_info,ptr->mem_buffer[local_50],byte_count,lVar2);
    }
    else {
      (*(ptr->b_s_info).write_backing_store)
                (cinfo,&ptr->b_s_info,ptr->mem_buffer[local_50],byte_count,lVar2);
    }
    byte_count = lVar2 + byte_count;
    local_50 = (ulong)ptr->rowsperchunk + local_50;
  }
  return;
}

Assistant:

LOCAL(void)
do_sarray_io (j_common_ptr cinfo, jvirt_sarray_ptr ptr, boolean writing)
/* Do backing store read or write of a virtual sample array */
{
  long bytesperrow, file_offset, byte_count, rows, thisrow, i;

  bytesperrow = (long) ptr->samplesperrow * SIZEOF(JSAMPLE);
  file_offset = ptr->cur_start_row * bytesperrow;
  /* Loop to read or write each allocation chunk in mem_buffer */
  for (i = 0; i < (long) ptr->rows_in_mem; i += ptr->rowsperchunk) {
    /* One chunk, but check for short chunk at end of buffer */
    rows = MIN((long) ptr->rowsperchunk, (long) ptr->rows_in_mem - i);
    /* Transfer no more than is currently defined */
    thisrow = (long) ptr->cur_start_row + i;
    rows = MIN(rows, (long) ptr->first_undef_row - thisrow);
    /* Transfer no more than fits in file */
    rows = MIN(rows, (long) ptr->rows_in_array - thisrow);
    if (rows <= 0)		/* this chunk might be past end of file! */
      break;
    byte_count = rows * bytesperrow;
    if (writing)
      (*ptr->b_s_info.write_backing_store) (cinfo, & ptr->b_s_info,
					    (void FAR *) ptr->mem_buffer[i],
					    file_offset, byte_count);
    else
      (*ptr->b_s_info.read_backing_store) (cinfo, & ptr->b_s_info,
					   (void FAR *) ptr->mem_buffer[i],
					   file_offset, byte_count);
    file_offset += byte_count;
  }
}